

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkPrintNodes(Cba_Ntk_t *p,int Type)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char *pTypeNames [90];
  char *local_308 [91];
  
  Cba_ManCreatePrimMap(local_308);
  printf("Operation %s\n",local_308[Type]);
  iVar3 = (p->vObjType).nSize;
  if (1 < iVar3) {
    uVar6 = 1;
    uVar7 = 0;
    do {
      lVar4 = (long)iVar3;
      if (lVar4 <= (long)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar6] != '\0') {
        if ((long)(p->vObjFin0).nSize <= (long)uVar6) goto LAB_003aa83f;
        iVar3 = (p->vObjFin0).pArray[uVar6];
        if ((long)iVar3 < 1) {
LAB_003aa85e:
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        uVar9 = (p->vFinFon).nSize;
        if (((int)uVar9 <= iVar3) || (uVar9 <= iVar3 + 1U)) goto LAB_003aa83f;
        piVar1 = (p->vFinFon).pArray;
        uVar9 = piVar1[iVar3];
        uVar8 = piVar1[iVar3 + 1U];
        printf("%8d  :",uVar7);
        printf("%8d  :  ",uVar6 & 0xffffffff);
        if ((long)(p->vObjFon0).nSize <= (long)uVar6) goto LAB_003aa83f;
        uVar2 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar6]);
        iVar3 = Cba_ObjSigned(p,(int)uVar6);
        pcVar5 = "s";
        if (iVar3 == 0) {
          pcVar5 = " ";
        }
        printf("%3d%s = ",(ulong)uVar2,pcVar5);
        if ((long)(p->vObjFin0).nSize <= (long)uVar6) goto LAB_003aa83f;
        iVar3 = (p->vObjFin0).pArray[uVar6];
        if ((long)iVar3 < 1) goto LAB_003aa85e;
        if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa83f;
        iVar3 = (p->vFinFon).pArray[iVar3];
        if ((long)iVar3 < 1) {
LAB_003aa87d:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
        }
        if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa83f;
        uVar2 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
        iVar3 = Cba_ObjSigned(p,uVar9);
        pcVar5 = "s";
        if (iVar3 == 0) {
          pcVar5 = " ";
        }
        printf("%3d%s  %s ",(ulong)uVar2,pcVar5,local_308[Type]);
        if ((long)(p->vObjFin0).nSize <= (long)uVar6) goto LAB_003aa83f;
        iVar3 = (p->vObjFin0).pArray[uVar6];
        if (iVar3 < 0) goto LAB_003aa85e;
        uVar2 = iVar3 + 1;
        if ((p->vFinFon).nSize <= (int)uVar2) goto LAB_003aa83f;
        iVar3 = (p->vFinFon).pArray[uVar2];
        if ((long)iVar3 < 1) goto LAB_003aa87d;
        if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa83f;
        uVar2 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
        iVar3 = Cba_ObjSigned(p,uVar8);
        pcVar5 = "s";
        if (iVar3 == 0) {
          pcVar5 = " ";
        }
        printf("%3d%s ",(ulong)uVar2,pcVar5);
        printf(" :    ");
        if ((p->vObjName).nSize < 1) {
          __assert_fail("Cba_NtkHasObjNames(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(&p->vObjName,(int)uVar6 + 1,0);
        if ((long)(p->vObjName).nSize <= (long)uVar6) goto LAB_003aa83f;
        pcVar5 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar6]);
        printf("%-12s =  ",pcVar5);
        if (-1 < (int)uVar9) {
          if (0 < (p->vFonName).nSize) {
            if ((ulong)uVar9 != 0) {
              Vec_IntFillExtra(&p->vFonName,uVar9 + 1,0);
              if ((p->vFonName).nSize <= (int)uVar9) goto LAB_003aa83f;
              uVar9 = (p->vFonName).pArray[uVar9];
              lVar4 = 0x10;
              goto LAB_003aa776;
            }
LAB_003aa8bb:
            pcVar5 = "Cba_FonIsReal(f)";
            goto LAB_003aa8cb;
          }
LAB_003aa8c4:
          pcVar5 = "Cba_NtkHasFonNames(p)";
LAB_003aa8cb:
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
        }
        uVar9 = ~uVar9;
        lVar4 = 0x18;
LAB_003aa776:
        pcVar5 = Abc_NamStr(*(Abc_Nam_t **)((long)p->pDesign->pTypeNames + lVar4 + -0x70),uVar9);
        printf("%-12s  %s  ",pcVar5,local_308[Type]);
        if ((int)uVar8 < 0) {
          uVar8 = ~uVar8;
          lVar4 = 0x18;
        }
        else {
          if ((p->vFonName).nSize < 1) goto LAB_003aa8c4;
          if ((ulong)uVar8 == 0) goto LAB_003aa8bb;
          Vec_IntFillExtra(&p->vFonName,uVar8 + 1,0);
          if ((p->vFonName).nSize <= (int)uVar8) {
LAB_003aa83f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar8 = (p->vFonName).pArray[uVar8];
          lVar4 = 0x10;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
        pcVar5 = Abc_NamStr(*(Abc_Nam_t **)((long)p->pDesign->pTypeNames + lVar4 + -0x70),uVar8);
        printf("%-12s ",pcVar5);
        putchar(10);
        iVar3 = (p->vObjType).nSize;
        lVar4 = (long)iVar3;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < lVar4);
  }
  return;
}

Assistant:

void Cba_NtkPrintNodes( Cba_Ntk_t * p, int Type )
{
    int i, iFon0, iFon1, Counter = 0;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "Operation %s\n", pTypeNames[Type] );
    Cba_NtkForEachObj( p, i )
    {
        if ( (int)Type != Type )
            continue;
        iFon0 = Cba_ObjFinFon(p, i, 0);
        iFon1 = Cba_ObjFinFon(p, i, 1);

        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Cba_ObjRangeSize(p, i),                      Cba_ObjSigned(p, i) ? "s" : " " );
        printf( "%3d%s  %s ",  Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSigned(p, iFon0) ? "s" : " ", pTypeNames[Type] );
        printf( "%3d%s ",      Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)), Cba_ObjSigned(p, iFon1) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Cba_ObjNameStr(p, i) );
        printf( "%-12s  %s  ", Cba_FonIsConst(iFon0) ? Cba_NtkConst(p, Cba_FonConst(iFon0)) : Cba_FonNameStr(p, iFon0), pTypeNames[Type] );
        printf( "%-12s ",      Cba_FonIsConst(iFon1) ? Cba_NtkConst(p, Cba_FonConst(iFon1)) : Cba_FonNameStr(p, iFon1) );
        printf( "\n" );
    }
}